

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_expand_front(void)

{
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  allocator_type local_79;
  circular_view<int,_4UL> span;
  vector<int,_std::allocator<int>_> expect;
  int local_38 [4];
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&expect;
  vista::circular_view<int,_4UL>::assign(&span,input);
  if (span.member.size == 4) {
    span.member.size = 4;
    span.member.next = (ulong)((int)span.member.next - 1U & 3) | 4;
  }
  else {
    span.member.size = span.member.size + 1;
  }
  local_38[0] = 0;
  local_38[1] = 0xb;
  local_38[2] = 0x16;
  local_38[3] = 0x21;
  __l._M_len = 4;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_79);
  first_begin.current._0_4_ = (uint)span.member.next - (int)span.member.size & 7;
  second_end._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current._0_4_ = (uint)span.member.next & 7;
  first_end.parent = &span;
  first_end.current._4_4_ = 0;
  first_begin.parent = &span;
  first_begin.current._4_4_ = 0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x412,"void api_fixed_suite::fixed_expand_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void fixed_expand_front()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = { 11, 22, 33 };
    span.expand_front();
    {
        std::vector<int> expect = { 0, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}